

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uint ZSTD_isFrame(void *buffer,size_t size)

{
  U32 UVar1;
  U32 magic;
  size_t size_local;
  void *buffer_local;
  
  if (size < 4) {
    buffer_local._4_4_ = 0;
  }
  else {
    UVar1 = MEM_readLE32(buffer);
    if (UVar1 == 0xfd2fb528) {
      buffer_local._4_4_ = 1;
    }
    else if ((UVar1 & 0xfffffff0) == 0x184d2a50) {
      buffer_local._4_4_ = 1;
    }
    else {
      buffer_local._4_4_ = 0;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

unsigned ZSTD_isFrame(const void* buffer, size_t size)
{
    if (size < ZSTD_FRAMEIDSIZE) return 0;
    {   U32 const magic = MEM_readLE32(buffer);
        if (magic == ZSTD_MAGICNUMBER) return 1;
        if ((magic & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) return 1;
    }
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(buffer, size)) return 1;
#endif
    return 0;
}